

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_free(REF_INTERP ref_interp)

{
  REF_INTERP ref_interp_local;
  
  if (ref_interp == (REF_INTERP)0x0) {
    ref_interp_local._4_4_ = 2;
  }
  else {
    ref_search_free(ref_interp->ref_search);
    ref_list_free(ref_interp->visualize);
    ref_agents_free(ref_interp->ref_agents);
    if (ref_interp->bary != (REF_DBL *)0x0) {
      free(ref_interp->bary);
    }
    if (ref_interp->part != (REF_INT *)0x0) {
      free(ref_interp->part);
    }
    if (ref_interp->cell != (REF_INT *)0x0) {
      free(ref_interp->cell);
    }
    if (ref_interp->agent_hired != (REF_BOOL *)0x0) {
      free(ref_interp->agent_hired);
    }
    if (ref_interp->from_cell_freeable != 0) {
      ref_cell_free(ref_interp->from_tri);
      ref_cell_free(ref_interp->from_tet);
    }
    if (ref_interp != (REF_INTERP)0x0) {
      free(ref_interp);
    }
    ref_interp_local._4_4_ = 0;
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_free(REF_INTERP ref_interp) {
  if (NULL == (void *)ref_interp) return REF_NULL;
  ref_search_free(ref_interp->ref_search);
  ref_list_free(ref_interp->visualize);
  ref_agents_free(ref_interp->ref_agents);
  ref_free(ref_interp->bary);
  ref_free(ref_interp->part);
  ref_free(ref_interp->cell);
  ref_free(ref_interp->agent_hired);
  if (ref_interp_from_cell_freeable(ref_interp)) {
    ref_cell_free(ref_interp_from_tri(ref_interp));
    ref_cell_free(ref_interp_from_tet(ref_interp));
  }
  ref_free(ref_interp);
  return REF_SUCCESS;
}